

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestTable::testTable(TestTable *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  TableViewSection *pTVar5;
  TableViewCell *pTVar6;
  QPoint *pQVar7;
  undefined8 uVar8;
  QWidget *this_00;
  QRect r;
  QPoint p;
  
  QWidget::resize((QWidget *)(this->m_v).value,200,400);
  QWidget::show();
  bVar1 = (bool)QTest::qWaitForWindowActive((QWidget *)(this->m_v).value,5000);
  cVar2 = QTest::qVerify(bVar1,"QTest::qWaitForWindowActive( m_v.data() )","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                         ,0x68);
  if (cVar2 != '\0') {
    pTVar5 = QtMWidgets::TableView::sectionAt((this->m_v).value,0);
    cVar2 = QTest::qVerify(pTVar5 == this->m_ringerAndAlerts,
                           "m_v->sectionAt( 0 ) == m_ringerAndAlerts","",
                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                           ,0x6a);
    if (cVar2 != '\0') {
      pTVar5 = QtMWidgets::TableView::sectionAt((this->m_v).value,1);
      cVar2 = QTest::qVerify(pTVar5 == this->m_sounds,"m_v->sectionAt( 1 ) == m_sounds","",
                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                             ,0x6b);
      if (cVar2 != '\0') {
        bVar1 = QtMWidgets::TableView::highlightCellOnClick((this->m_v).value);
        cVar2 = QTest::qVerify(bVar1,"m_v->highlightCellOnClick() == true","",
                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                               ,0x6d);
        if (cVar2 != '\0') {
          bVar1 = QtMWidgets::TableViewSection::highlightCellOnClick(this->m_ringerAndAlerts);
          cVar2 = QTest::qVerify(bVar1,"m_ringerAndAlerts->highlightCellOnClick() == true","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                 ,0x6e);
          if (cVar2 != '\0') {
            iVar3 = QtMWidgets::TableViewSection::cellsCount(this->m_ringerAndAlerts);
            cVar2 = QTest::qVerify(iVar3 == 2,"m_ringerAndAlerts->cellsCount() == 2","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                   ,0x70);
            if (cVar2 != '\0') {
              pTVar6 = QtMWidgets::TableViewSection::cellAt(this->m_ringerAndAlerts,0);
              cVar2 = QTest::qVerify(pTVar6 == this->m_volume,
                                     "m_ringerAndAlerts->cellAt( 0 ) == m_volume","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                     ,0x71);
              if (cVar2 != '\0') {
                bVar1 = QtMWidgets::TableViewCell::highlightOnClick(this->m_volume);
                cVar2 = QTest::qVerify(bVar1,"m_volume->highlightOnClick() == true","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                       ,0x72);
                if (cVar2 != '\0') {
                  QtMWidgets::ScrollArea::ensureWidgetVisible
                            (&((this->m_v).value)->super_ScrollArea,
                             &this->m_facebookPost->super_QWidget,0x32,0x32);
                  QTest::qWait(0x226);
                  pTVar5 = this->m_sounds;
                  pQVar7 = (QPoint *)
                           QtMWidgets::AbstractScrollArea::viewport
                                     ((AbstractScrollArea *)(this->m_v).value);
                  uVar8 = QWidget::pos();
                  r.x1 = (int)uVar8;
                  r.y1 = (int)((ulong)uVar8 >> 0x20);
                  p = (QPoint)QWidget::mapTo(&pTVar5->super_QWidget,pQVar7);
                  this_00 = QtMWidgets::AbstractScrollArea::viewport
                                      ((AbstractScrollArea *)(this->m_v).value);
                  r = QWidget::rect(this_00);
                  bVar1 = (bool)QRect::contains((QPoint *)&r,SUB81(&p,0));
                  cVar2 = QTest::qVerify(bVar1,"r.contains( p )","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                         ,0x7c);
                  if (cVar2 != '\0') {
                    iVar3 = QtMWidgets::TableViewSection::cellsCount(this->m_sounds);
                    QtMWidgets::TableViewSection::removeCell(this->m_sounds,this->m_facebookPost);
                    QObject::deleteLater();
                    QTest::qWait(0x32);
                    iVar4 = QtMWidgets::TableViewSection::cellsCount(this->m_sounds);
                    cVar2 = QTest::qVerify(iVar4 == iVar3 + -1,"m_sounds->cellsCount() == cc - 1",""
                                           ,
                                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                           ,0x86);
                    if (cVar2 != '\0') {
                      QtMWidgets::TableView::removeSection((this->m_v).value,this->m_sounds);
                      QObject::deleteLater();
                      iVar3 = QtMWidgets::TableView::sectionsCount((this->m_v).value);
                      cVar2 = QTest::qVerify(iVar3 == 1,"m_v->sectionsCount() == 1","",
                                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/table/main.cpp"
                                             ,0x8c);
                      if (cVar2 != '\0') {
                        QTest::qWait(0x32);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void testTable()
	{
		m_v->resize( 200, 400 );
		m_v->show();

		QVERIFY( QTest::qWaitForWindowActive( m_v.data() ) );

		QVERIFY( m_v->sectionAt( 0 ) == m_ringerAndAlerts );
		QVERIFY( m_v->sectionAt( 1 ) == m_sounds );

		QVERIFY( m_v->highlightCellOnClick() == true );
		QVERIFY( m_ringerAndAlerts->highlightCellOnClick() == true );

		QVERIFY( m_ringerAndAlerts->cellsCount() == 2 );
		QVERIFY( m_ringerAndAlerts->cellAt( 0 ) == m_volume );
		QVERIFY( m_volume->highlightOnClick() == true );

		m_v->ensureWidgetVisible( m_facebookPost );

		QTest::qWait( 550 );

		const auto p = m_sounds->mapTo( m_v->viewport(), m_facebookPost->pos() );

		const QRect r = m_v->viewport()->rect();

		QVERIFY( r.contains( p ) );

		const auto cc = m_sounds->cellsCount();

		m_sounds->removeCell( m_facebookPost );

		m_facebookPost->deleteLater();

		QTest::qWait( 50 );

		QVERIFY( m_sounds->cellsCount() == cc - 1 );

		m_v->removeSection( m_sounds );

		m_sounds->deleteLater();

		QVERIFY( m_v->sectionsCount() == 1 );

		QTest::qWait( 50 );
	}